

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

ModelPtr __thiscall libcellml::Importer::library(Importer *this,string *key)

{
  ImporterImpl *pIVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPtr MVar4;
  undefined1 local_40 [8];
  string normalisedKey;
  string *key_local;
  Importer *this_local;
  
  normaliseDirectorySeparator((string *)local_40,in_RDX);
  pIVar1 = pFunc((Importer *)key);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::count(&pIVar1->mLibrary,(key_type *)local_40);
  if (sVar2 == 0) {
    std::shared_ptr<libcellml::Model>::shared_ptr
              ((shared_ptr<libcellml::Model> *)this,(nullptr_t)0x0);
  }
  else {
    pIVar1 = pFunc((Importer *)key);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
             ::operator[](&pIVar1->mLibrary,(key_type *)local_40);
    std::shared_ptr<libcellml::Model>::shared_ptr((shared_ptr<libcellml::Model> *)this,pmVar3);
  }
  std::__cxx11::string::~string((string *)local_40);
  MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Importer::library(const std::string &key)
{
    auto normalisedKey = normaliseDirectorySeparator(key);
    if (pFunc()->mLibrary.count(normalisedKey) != 0) {
        return pFunc()->mLibrary[normalisedKey];
    }
    return nullptr;
}